

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O0

bool __thiscall Tag::getCloseTag(Tag *this,string *s)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [383];
  byte local_19;
  string *psStack_18;
  bool success;
  string *s_local;
  Tag *this_local;
  
  local_19 = 1;
  psStack_18 = s;
  s_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"</");
  StreamObject::getName_abi_cxx11_(&local_1d8,&this->super_StreamObject);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  std::operator<<(poVar3,">");
  std::__cxx11::string::~string((string *)&local_1d8);
  __lhs = psStack_18;
  std::__cxx11::stringstream::str();
  bVar2 = std::operator!=(__lhs,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (bVar2) {
    local_19 = 0;
  }
  bVar1 = local_19;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Tag::getCloseTag( std::string &s )
{
	bool success = true;

	std::stringstream stream;

	stream << "</" << getName() << ">";

	if ( s != stream.str() )
	{
		//std::cerr << "Syntax error: \"</" << getName() << ">\" expected." << std::endl;
		success = false;
	}

	return success;
}